

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void searchlight_caught(tgestate_t *state,searchlight_movement_t *slstate)

{
  byte bVar1;
  byte bVar2;
  byte *in_RSI;
  tgestate_t *in_RDI;
  uint8_t x;
  uint8_t y;
  uint8_t mappos_x;
  uint8_t mappos_y;
  
  bVar1 = (in_RDI->map_position).y;
  bVar2 = (in_RDI->map_position).x;
  if ((((*in_RSI + 5 < bVar2 + 0xc) && (bVar2 + 10 <= *in_RSI + 10)) && (in_RSI[1] + 5 < bVar1 + 10)
      ) && ((bVar1 + 6 < in_RSI[1] + 0xc && (in_RDI->searchlight_state != '\x1f')))) {
    in_RDI->searchlight_state = '\x1f';
    (in_RDI->searchlight).caught_coord.y = in_RSI[1];
    (in_RDI->searchlight).caught_coord.x = *in_RSI;
    in_RDI->bell = '\0';
    decrease_morale(in_RDI,'\n');
  }
  return;
}

Assistant:

void searchlight_caught(tgestate_t                   *state,
                        const searchlight_movement_t *slstate)
{
  uint8_t mappos_y, mappos_x; /* was D,E */
  uint8_t y, x;

  assert(state   != NULL);
  assert(slstate != NULL);

  /* Note that this code can get hit even when the hero is in bed... */

  mappos_y = state->map_position.y;
  mappos_x = state->map_position.x;
  x        = slstate->xy.x;
  y        = slstate->xy.y;

  if (x + 5 >= mappos_x + 12 || x + 10 <  mappos_x + 10 ||
      y + 5 >= mappos_y + 10 || y + 12 <= mappos_y + 6)
    return;

  /* It seems odd to not do this (cheaper) test sooner. */
  if (state->searchlight_state == searchlight_STATE_CAUGHT)
    return; /* already caught */

  state->searchlight_state = searchlight_STATE_CAUGHT;

  state->searchlight.caught_coord.y = slstate->xy.y;
  state->searchlight.caught_coord.x = slstate->xy.x;

  state->bell = bell_RING_PERPETUAL;

  decrease_morale(state, 10); /* was tail call */
}